

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  CppType CVar2;
  int iVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  LogFinisher local_61;
  LogMessage local_60;
  MessageLite *pMVar6;
  
  pVar7 = Insert(this,number);
  pEVar4 = pVar7.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    CVar2 = anon_unknown_26::cpp_type(pEVar4->type);
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = pEVar4->field_0xa;
    pEVar4->field_0xa = bVar1 & 0xf0;
    pMVar6 = (pEVar4->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      iVar3 = (*pMVar6->_vptr_MessageLite[4])(pMVar6,prototype,this->arena_);
      pMVar6 = (MessageLite *)CONCAT44(extraout_var_00,iVar3);
    }
  }
  else {
    pEVar4->type = type;
    CVar2 = anon_unknown_26::cpp_type(type);
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x288);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
    pEVar4->is_repeated = false;
    pEVar4->field_0xa = pEVar4->field_0xa & 0xf;
    iVar3 = (*prototype->_vptr_MessageLite[3])(prototype,this->arena_);
    pMVar6 = (MessageLite *)CONCAT44(extraout_var,iVar3);
    (pEVar4->field_0).int64_t_value = (int64_t)pMVar6;
    pEVar4->field_0xa = pEVar4->field_0xa & 0xf0;
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype, arena_);
    } else {
      return extension->message_value;
    }
  }
}